

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O2

void __thiscall
slang::DiagnosticEngine::setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>
          (DiagnosticEngine *this,BufferID buffer,
          span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>
          directives,Diagnostics *diags)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  char *pcVar3;
  undefined4 uVar4;
  value_type_pointer ppVar5;
  DiagCode *pDVar6;
  uint uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  string_view name;
  string_view name_00;
  bool bVar10;
  DiagGroup *pDVar11;
  Diagnostic *this_00;
  DiagnosticDirectiveInfo *directive;
  ulong uVar12;
  DiagnosticEngine *pDVar13;
  DiagnosticEngine *pDVar14;
  DiagCode *pDVar15;
  ulong uVar16;
  DiagCode DVar17;
  value_type_pointer ppVar18;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
  *this_01;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uchar uVar24;
  char cVar25;
  uchar uVar26;
  char cVar27;
  uchar uVar28;
  char cVar29;
  byte bVar30;
  byte bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  span<const_slang::DiagCode,_18446744073709551615UL> sVar35;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  try_emplace_args_t local_10d;
  BufferID buffer_local;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  DiagnosticEngine *local_f8;
  pair<const_slang::DiagCode,_slang::DiagnosticSeverity> local_f0;
  size_t in_stack_ffffffffffffff18;
  pointer in_stack_ffffffffffffff20;
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  mappingStack;
  locator local_b0;
  Diagnostics *local_98;
  DiagnosticDirectiveInfo *local_90;
  iterator __begin5;
  anon_class_24_3_94aef59f noteDiag;
  
  directive = directives._M_ptr;
  mappingStack.
  super__Vector_base<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mappingStack.
  super__Vector_base<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mappingStack.
  super__Vector_base<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer_local = buffer;
  local_98 = diags;
  std::
  vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
  ::emplace_back<>(&mappingStack);
  noteDiag.buffer = &buffer_local;
  local_90 = directive + directives._M_extent._M_extent_value._M_extent_value;
  local_f8 = this;
  noteDiag.this = this;
  noteDiag.mappingStack = &mappingStack;
  do {
    if (directive == local_90) {
      std::
      vector<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
      ::~vector(&mappingStack);
      return;
    }
    local_108._M_len = (directive->name)._M_len;
    local_108._M_str = (directive->name)._M_str;
    __y._M_str = "__push__";
    __y._M_len = 8;
    bVar10 = std::operator==(local_108,__y);
    if (bVar10) {
      std::
      vector<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>,std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>>>
      ::
      emplace_back<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>&>
                ((vector<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>,std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,slang::DiagnosticSeverity,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>>>
                  *)&mappingStack,
                 mappingStack.
                 super__Vector_base<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
    }
    else {
      __y_00._M_str = "__pop__";
      __y_00._M_len = 7;
      bVar10 = std::operator==(local_108,__y_00);
      if (bVar10) {
        in_stack_ffffffffffffff18 =
             (long)mappingStack.
                   super__Vector_base<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)mappingStack.
                   super__Vector_base<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        in_stack_ffffffffffffff20 =
             mappingStack.
             super__Vector_base<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if (1 < (ulong)((long)in_stack_ffffffffffffff18 / 0x30)) {
          __begin5 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                     ::begin(&mappingStack.
                              super__Vector_base<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].table_);
          pDVar14 = local_f8;
          while (__begin5.p_ != (table_element_pointer)0x0) {
            local_f0 = *__begin5.p_;
            DVar17 = local_f0.first;
            auVar32 = ZEXT416((int)DVar17 << 0x10 | (uint)DVar17 >> 0x10) *
                      ZEXT816(0x9e3779b97f4a7c15);
            uVar19 = auVar32._8_8_ ^ auVar32._0_8_;
            uVar12 = uVar19 >> ((byte)(pDVar14->diagMappings).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                                      .arrays.groups_size_index & 0x3f);
            uVar4 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar19 & 0xff];
            ppVar18 = (pDVar14->diagMappings).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                      .arrays.elements_;
            uVar22 = (pDVar14->diagMappings).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                     .arrays.groups_size_mask;
            uVar16 = 0;
            uVar21 = uVar12;
            do {
              pgVar1 = (pDVar14->diagMappings).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                       .arrays.groups_ + uVar21;
              bVar31 = pgVar1->m[0xf].n;
              uVar24 = (uchar)uVar4;
              auVar32[0] = -(pgVar1->m[0].n == uVar24);
              uVar26 = (uchar)((uint)uVar4 >> 8);
              auVar32[1] = -(pgVar1->m[1].n == uVar26);
              uVar28 = (uchar)((uint)uVar4 >> 0x10);
              auVar32[2] = -(pgVar1->m[2].n == uVar28);
              bVar30 = (byte)((uint)uVar4 >> 0x18);
              auVar32[3] = -(pgVar1->m[3].n == bVar30);
              auVar32[4] = -(pgVar1->m[4].n == uVar24);
              auVar32[5] = -(pgVar1->m[5].n == uVar26);
              auVar32[6] = -(pgVar1->m[6].n == uVar28);
              auVar32[7] = -(pgVar1->m[7].n == bVar30);
              auVar32[8] = -(pgVar1->m[8].n == uVar24);
              auVar32[9] = -(pgVar1->m[9].n == uVar26);
              auVar32[10] = -(pgVar1->m[10].n == uVar28);
              auVar32[0xb] = -(pgVar1->m[0xb].n == bVar30);
              auVar32[0xc] = -(pgVar1->m[0xc].n == uVar24);
              auVar32[0xd] = -(pgVar1->m[0xd].n == uVar26);
              auVar32[0xe] = -(pgVar1->m[0xe].n == uVar28);
              auVar32[0xf] = -(bVar31 == bVar30);
              for (uVar23 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe);
                  uVar23 != 0; uVar23 = uVar23 - 1 & uVar23) {
                uVar7 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                if (ppVar18[uVar21 * 0xf + (ulong)uVar7].first == DVar17) {
                  ppVar18 = ppVar18 + uVar21 * 0xf + (ulong)uVar7;
                  goto LAB_00169e3f;
                }
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7] & bVar31) == 0)
              break;
              lVar20 = uVar21 + uVar16;
              uVar16 = uVar16 + 1;
              uVar21 = lVar20 + 1U & uVar22;
            } while (uVar16 <= uVar22);
            if ((pDVar14->diagMappings).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                .size_ctrl.size <
                (pDVar14->diagMappings).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_boost::unordered::unordered_flat_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>,_slang::hash<slang::BufferID>_>_>_>_>
                .size_ctrl.ml) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
              ::
              unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::DiagCode_const&>
                        (&local_b0,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
                          *)&this->diagMappings,uVar12,uVar19,&local_10d,&local_f0.first);
              ppVar18 = local_b0.p;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::DiagCode_const&>
                        (&local_b0,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,boost::unordered::unordered_flat_map<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>>>
                          *)&this->diagMappings,uVar19,&local_10d,&local_f0.first);
              ppVar18 = local_b0.p;
            }
LAB_00169e3f:
            uVar16 = SUB168(ZEXT416(buffer_local.id) * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(ZEXT416(buffer_local.id) * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar21 = uVar16 >> ((byte)(ppVar18->second).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                                      .arrays.groups_size_index & 0x3f);
            uVar4 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar16 & 0xff];
            uVar12 = 0;
            pDVar13 = pDVar14;
            uVar22 = uVar21;
            do {
              pgVar2 = (ppVar18->second).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                       .arrays.groups_ + uVar22;
              bVar31 = pgVar2->m[0xf].n;
              uVar24 = (uchar)uVar4;
              auVar33[0] = -(pgVar2->m[0].n == uVar24);
              uVar26 = (uchar)((uint)uVar4 >> 8);
              auVar33[1] = -(pgVar2->m[1].n == uVar26);
              uVar28 = (uchar)((uint)uVar4 >> 0x10);
              auVar33[2] = -(pgVar2->m[2].n == uVar28);
              bVar30 = (byte)((uint)uVar4 >> 0x18);
              auVar33[3] = -(pgVar2->m[3].n == bVar30);
              auVar33[4] = -(pgVar2->m[4].n == uVar24);
              auVar33[5] = -(pgVar2->m[5].n == uVar26);
              auVar33[6] = -(pgVar2->m[6].n == uVar28);
              auVar33[7] = -(pgVar2->m[7].n == bVar30);
              auVar33[8] = -(pgVar2->m[8].n == uVar24);
              auVar33[9] = -(pgVar2->m[9].n == uVar26);
              auVar33[10] = -(pgVar2->m[10].n == uVar28);
              auVar33[0xb] = -(pgVar2->m[0xb].n == bVar30);
              auVar33[0xc] = -(pgVar2->m[0xc].n == uVar24);
              auVar33[0xd] = -(pgVar2->m[0xd].n == uVar26);
              auVar33[0xe] = -(pgVar2->m[0xe].n == uVar28);
              auVar33[0xf] = -(bVar31 == bVar30);
              uVar23 = (uint)(ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe);
              if (uVar23 != 0) {
                ppVar5 = (ppVar18->second).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                         .arrays.elements_;
                do {
                  iVar8 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
                    }
                  }
                  pDVar13 = local_f8;
                  if (buffer_local.id ==
                      *(uint32_t *)
                       ((long)&ppVar5[uVar22 * 0xf].first.id + (ulong)(uint)(iVar8 << 5))) {
                    ppVar18 = (value_type_pointer)
                              ((long)&ppVar5[uVar22 * 0xf].first.id + (ulong)(uint)(iVar8 << 5));
                    goto LAB_00169f4b;
                  }
                  uVar23 = uVar23 - 1 & uVar23;
                } while (uVar23 != 0);
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bVar31) == 0)
              break;
              uVar19 = (ppVar18->second).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                       .arrays.groups_size_mask;
              lVar20 = uVar22 + uVar12;
              uVar12 = uVar12 + 1;
              uVar22 = lVar20 + 1U & uVar19;
            } while (uVar12 <= uVar19);
            if ((ppVar18->second).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                .size_ctrl.size <
                (ppVar18->second).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>
                .size_ctrl.ml) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
              ::
              unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID_const&>
                        ((locator *)&local_b0,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
                          *)&ppVar18->second,uVar21,uVar16,&local_10d,&buffer_local);
              ppVar18 = local_b0.p;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID_const&>
                        ((locator *)&local_b0,
                         (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
                          *)&ppVar18->second,uVar16,&local_10d,&buffer_local);
              ppVar18 = local_b0.p;
            }
LAB_00169f4b:
            pDVar14 = local_f8;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = (ulong)local_f0 >> 0x10 & 0xffff |
                           (ulong)(uint)((int)local_f0.first << 0x10);
            uVar21 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar22 = uVar21 >> (*(byte *)((long)&in_stack_ffffffffffffff20[-2].table_.
                                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                                                 .arrays.groups_size_index +
                                         in_stack_ffffffffffffff18) & 0x3f);
            uVar4 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar21 & 0xff];
            uVar12 = 0;
            do {
              pcVar3 = (char *)(*(long *)((long)in_stack_ffffffffffffff20 +
                                         (in_stack_ffffffffffffff18 - 0x50)) + uVar22 * 0x10);
              cVar25 = (char)uVar4;
              auVar34[0] = -(*pcVar3 == cVar25);
              cVar27 = (char)((uint)uVar4 >> 8);
              auVar34[1] = -(pcVar3[1] == cVar27);
              cVar29 = (char)((uint)uVar4 >> 0x10);
              auVar34[2] = -(pcVar3[2] == cVar29);
              bVar31 = (byte)((uint)uVar4 >> 0x18);
              auVar34[3] = -(pcVar3[3] == bVar31);
              auVar34[4] = -(pcVar3[4] == cVar25);
              auVar34[5] = -(pcVar3[5] == cVar27);
              auVar34[6] = -(pcVar3[6] == cVar29);
              auVar34[7] = -(pcVar3[7] == bVar31);
              auVar34[8] = -(pcVar3[8] == cVar25);
              auVar34[9] = -(pcVar3[9] == cVar27);
              auVar34[10] = -(pcVar3[10] == cVar29);
              auVar34[0xb] = -(pcVar3[0xb] == bVar31);
              auVar34[0xc] = -(pcVar3[0xc] == cVar25);
              auVar34[0xd] = -(pcVar3[0xd] == cVar27);
              auVar34[0xe] = -(pcVar3[0xe] == cVar29);
              auVar34[0xf] = -(pcVar3[0xf] == bVar31);
              uVar23 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
              if (uVar23 != 0) {
                lVar20 = *(long *)((long)in_stack_ffffffffffffff20 +
                                  (in_stack_ffffffffffffff18 - 0x48)) + uVar22 * 0x78;
                do {
                  uVar7 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                    }
                  }
                  if (local_f0.first == *(DiagCode *)(lVar20 + (ulong)uVar7 * 8)) {
                    std::
                    vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
                    ::emplace_back<unsigned_long_const&,slang::DiagnosticSeverity&>
                              ((vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
                                *)&ppVar18->second,&directive->offset,
                               (DiagnosticSeverity *)(lVar20 + (ulong)uVar7 * 8 + 4));
                    goto LAB_0016a06f;
                  }
                  uVar23 = uVar23 - 1 & uVar23;
                  pDVar13 = local_f8;
                } while (uVar23 != 0);
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & pcVar3[0xf]) == 0)
              break;
              uVar16 = *(ulong *)((long)in_stack_ffffffffffffff20 +
                                 (in_stack_ffffffffffffff18 - 0x58));
              lVar20 = uVar22 + uVar12;
              uVar12 = uVar12 + 1;
              uVar22 = lVar20 + 1U & uVar16;
            } while (uVar12 <= uVar16);
            std::
            vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
            ::emplace_back<unsigned_long_const&,std::nullopt_t_const&>
                      ((vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>
                        *)&ppVar18->second,&directive->offset,(nullopt_t *)&std::nullopt);
            pDVar14 = pDVar13;
LAB_0016a06f:
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
            ::increment(&__begin5);
          }
          this_01 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                     *)(mappingStack.
                        super__Vector_base<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
          mappingStack.
          super__Vector_base<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>,_std::allocator<boost::unordered::unordered_flat_map<slang::DiagCode,_slang::DiagnosticSeverity,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_01;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::DiagCode,_void>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
          ::~table_core(this_01);
        }
      }
      else {
        __x._M_str = "-W";
        __x._M_len = 2;
        bVar10 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with(&local_108,__x);
        if (bVar10) {
          local_108 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                (&local_108,2,0xffffffffffffffff);
        }
        name._M_str = (char *)in_stack_ffffffffffffff20;
        name._M_len = in_stack_ffffffffffffff18;
        pDVar11 = findDefaultDiagGroup(name);
        if (pDVar11 == (DiagGroup *)0x0) {
          name_00._M_str = (char *)in_stack_ffffffffffffff20;
          name_00._M_len = in_stack_ffffffffffffff18;
          sVar35 = findDiagsFromOptionName(name_00);
          if (sVar35._M_extent._M_extent_value._M_extent_value == 0) {
            this_00 = Diagnostics::add(local_98,(DiagCode)0x1000f,
                                       (SourceLocation)
                                       (directive->offset << 0x1c |
                                       (ulong)(buffer_local.id & 0xfffffff)));
            Diagnostic::operator<<(this_00,local_108);
          }
          else {
            for (lVar20 = 0; sVar35._M_extent._M_extent_value._M_extent_value << 2 != lVar20;
                lVar20 = lVar20 + 4) {
              setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>(slang::BufferID,std::span<slang::SourceManager::DiagnosticDirectiveInfo_const,18446744073709551615ul>,slang::Diagnostics&)
              ::{lambda(slang::DiagCode,auto:1&)#1}::operator()
                        (&noteDiag,*(DiagCode *)((long)&(sVar35._M_ptr)->subsystem + lVar20),
                         directive);
            }
          }
        }
        else {
          pDVar6 = (pDVar11->diags).
                   super__Vector_base<slang::DiagCode,_std::allocator<slang::DiagCode>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pDVar15 = (pDVar11->diags).
                         super__Vector_base<slang::DiagCode,_std::allocator<slang::DiagCode>_>.
                         _M_impl.super__Vector_impl_data._M_start; pDVar15 != pDVar6;
              pDVar15 = pDVar15 + 1) {
            setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>(slang::BufferID,std::span<slang::SourceManager::DiagnosticDirectiveInfo_const,18446744073709551615ul>,slang::Diagnostics&)
            ::{lambda(slang::DiagCode,auto:1&)#1}::operator()(&noteDiag,*pDVar15,directive);
          }
        }
      }
    }
    directive = directive + 1;
  } while( true );
}

Assistant:

void DiagnosticEngine::setMappingsFromPragmasImpl(BufferID buffer,
                                                  std::span<const TDirective> directives,
                                                  Diagnostics& diags) {

    // Store the state of diagnostics each time the user pushes,
    // and restore the state when they pop.
    std::vector<flat_hash_map<DiagCode, DiagnosticSeverity>> mappingStack;
    mappingStack.emplace_back();

    auto noteDiag = [&](DiagCode code, auto& directive) {
        diagMappings[code][buffer].emplace_back(directive.offset, directive.severity);
        mappingStack.back()[code] = directive.severity;
    };

    for (const SourceManager::DiagnosticDirectiveInfo& directive : directives) {
        auto name = directive.name;
        if (name == "__push__") {
            mappingStack.emplace_back(mappingStack.back());
        }
        else if (name == "__pop__") {
            // If the stack size is 1, push was never called, so just ignore.
            if (mappingStack.size() <= 1)
                continue;

            // Any directives that were set revert to their previous values.
            // If there is no previous value, they go back to the default (unset).
            auto& prev = mappingStack[mappingStack.size() - 2];
            for (auto [code, _] : mappingStack.back()) {
                auto& mappings = diagMappings[code][buffer];
                if (auto it = prev.find(code); it != prev.end())
                    mappings.emplace_back(directive.offset, it->second);
                else
                    mappings.emplace_back(directive.offset, std::nullopt);
            }
            mappingStack.pop_back();
        }
        else {
            if (name.starts_with("-W"sv))
                name = name.substr(2);

            if (auto group = findDiagGroup(name)) {
                for (auto code : group->getDiags())
                    noteDiag(code, directive);
            }
            else if (auto codes = findFromOptionName(name); !codes.empty()) {
                for (auto code : codes)
                    noteDiag(code, directive);
            }
            else {
                auto& diag = diags.add(diag::UnknownWarningOption,
                                       SourceLocation(buffer, directive.offset));
                diag << name;
            }
        }
    }
}